

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O0

int dwarf_get_CHILDREN_name(uint val,char **s_out)

{
  char **s_out_local;
  uint val_local;
  
  if (val == 0) {
    *s_out = "DW_CHILDREN_no";
    s_out_local._4_4_ = 0;
  }
  else if (val == 1) {
    *s_out = "DW_CHILDREN_yes";
    s_out_local._4_4_ = 0;
  }
  else {
    s_out_local._4_4_ = -1;
  }
  return s_out_local._4_4_;
}

Assistant:

int
dwarf_get_CHILDREN_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_CHILDREN_no:
        *s_out = "DW_CHILDREN_no";
        return DW_DLV_OK;
    case DW_CHILDREN_yes:
        *s_out = "DW_CHILDREN_yes";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}